

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O0

void highs::parallel::for_each<HEkkDual::majorChooseRowBtran()::__0&>
               (HighsInt start,HighsInt end,anon_class_40_5_3855c632 *f,HighsInt grainSize)

{
  int in_ECX;
  int in_ESI;
  int in_EDI;
  HighsInt split;
  TaskGroup tg;
  anon_class_24_4_3f80b2e7_for_functor_conflict1 *in_stack_ffffffffffffffa8;
  TaskGroup *in_stack_ffffffffffffffb0;
  HighsInt in_stack_ffffffffffffffd8;
  HighsInt in_stack_ffffffffffffffdc;
  anon_class_40_5_3855c632 *in_stack_ffffffffffffffe0;
  undefined4 local_8;
  
  if (in_ECX < in_ESI - in_EDI) {
    TaskGroup::TaskGroup(in_stack_ffffffffffffffb0);
    local_8 = in_ESI;
    do {
      local_8 = in_EDI + local_8 >> 1;
      TaskGroup::
      spawn<highs::parallel::for_each<HEkkDual::majorChooseRowBtran()::__0&>(int,int,HEkkDual::majorChooseRowBtran()::__0&,int)::_lambda()_1_>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    } while (in_ECX < local_8 - in_EDI);
    HEkkDual::majorChooseRowBtran::anon_class_40_5_3855c632::operator()
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    TaskGroup::taskWait(in_stack_ffffffffffffffb0);
    TaskGroup::~TaskGroup(in_stack_ffffffffffffffb0);
  }
  else {
    HEkkDual::majorChooseRowBtran::anon_class_40_5_3855c632::operator()
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}